

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O1

void __thiscall
Test_TemplateModifiers_FindModifier::Test_TemplateModifiers_FindModifier
          (Test_TemplateModifiers_FindModifier *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(TemplateModifiers, FindModifier) {
  const GOOGLE_NAMESPACE::ModifierInfo* info;
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("html_escape", 11, "", 0)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::html_escape);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("h", 1, "", 0)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::html_escape);

  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("html_escape_with_arg", 20,
                                              "=pre", 4)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::pre_escape);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("H", 1, "=pre", 4)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::pre_escape);

  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("javascript_escape_with_arg",
                                              26, "=number", 7)));
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("J", 1, "=number", 7)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::javascript_number);

  // html_escape_with_arg doesn't have a default value, so these should fail.
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("H", 1, "=pre", 2));  // "=p"
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("H", 1, "=pree", 5));
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("H", 1, "=notpresent", 11));

  // If we don't have a modifier-value when we ought, we should fail.
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("html_escape", 11, "=p", 2));
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("h", 1, "=p", 2));

  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("html_escape_with_arg", 20,
                                       "", 0));
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("H", 1, "", 0));

  // Test with added modifiers as well.
  GOOGLE_NAMESPACE::NullModifier foo_modifier1;
  GOOGLE_NAMESPACE::NullModifier foo_modifier2;
  GOOGLE_NAMESPACE::NullModifier foo_modifier3;
  GOOGLE_NAMESPACE::NullModifier foo_modifier4;
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-test", &foo_modifier1));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-test-arg=", &foo_modifier2));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-test-arg=h", &foo_modifier3));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-test-arg=json", &foo_modifier4));

  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test", 6, "", 0)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier1);
  EXPECT_EQ(info->xss_class, GOOGLE_NAMESPACE::XSS_UNIQUE);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test", 6, "=h", 2)));
  EXPECT_FALSE(info->is_registered);
  // This tests default values
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "=p", 2)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "=h", 2)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier3);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "=html", 5)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "=json", 5)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier4);
  // The value is required to start with an '=' to match the
  // specialization.  If it doesn't, it will match the default.
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "json", 4)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10,
                                              "=jsonnabbe", 5)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier4);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10,
                                              "=jsonnabbe", 6)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10,
                                              "=jsonnabbe", 4)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);

  // If we try to find an x- modifier that wasn't added, we should get
  // a legit but "unknown" modifier back.
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-foo", 5, "", 0)));
  EXPECT_FALSE(info->is_registered);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-bar", 5, "=p", 2)));
  EXPECT_FALSE(info->is_registered);

  // Basic test with added XssSafe modifier.
  GOOGLE_NAMESPACE::NullModifier foo_modifier5;
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-safetest",
                                            &foo_modifier5));
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-safetest", 10, "", 0)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->xss_class, GOOGLE_NAMESPACE::XSS_SAFE);
  EXPECT_EQ(info->modifier, &foo_modifier5);
}